

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O3

float Imath_2_5::angle4D<float>(Quat<float> *q1,Quat<float> *q2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar6 = (q1->v).x;
  fVar1 = (q2->v).x;
  fVar4 = q1->r - q2->r;
  fVar9 = fVar6 - fVar1;
  fVar8 = (q1->v).y;
  fVar2 = (q2->v).y;
  fVar10 = fVar8 - fVar2;
  fVar7 = (q1->v).z;
  fVar3 = (q2->v).z;
  fVar11 = fVar7 - fVar3;
  fVar5 = q1->r + q2->r;
  fVar6 = fVar6 + fVar1;
  fVar8 = fVar8 + fVar2;
  fVar7 = fVar7 + fVar3;
  fVar6 = atan2f(SQRT(fVar4 * fVar4 + fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10),
                 SQRT(fVar5 * fVar5 + fVar7 * fVar7 + fVar6 * fVar6 + fVar8 * fVar8));
  return fVar6 + fVar6;
}

Assistant:

T
angle4D (const Quat<T> &q1, const Quat<T> &q2)
{
    //
    // Compute the angle between two quaternions,
    // interpreting the quaternions as 4D vectors.
    //

    Quat<T> d = q1 - q2;
    T lengthD = Math<T>::sqrt (d ^ d);

    Quat<T> s = q1 + q2;
    T lengthS = Math<T>::sqrt (s ^ s);

    return 2 * Math<T>::atan2 (lengthD, lengthS);
}